

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O2

bool duckdb::IsCompletionCharacter(char c)

{
  return c == '_' || (byte)((c & 0xdfU) + 0xbf) < 0x1a;
}

Assistant:

bool IsCompletionCharacter(char c) {
	if (c >= 'A' && c <= 'Z') {
		return true;
	}
	if (c >= 'a' && c <= 'z') {
		return true;
	}
	if (c == '_') {
		return true;
	}
	return false;
}